

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_translate.cpp
# Opt level: O3

void __thiscall
FRemapTable::AddDesaturation
          (FRemapTable *this,int start,int end,double r1,double g1,double b1,double r2,double g2,
          double b2)

{
  byte bVar1;
  BYTE BVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  double dVar9;
  uint uVar10;
  uint uVar11;
  uint uVar14;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  double dVar18;
  
  auVar12._8_8_ = r1;
  auVar12._0_8_ = g1;
  if (2.0 <= b1) {
    b1 = 2.0;
  }
  if (b1 <= 0.0) {
    b1 = 0.0;
  }
  auVar17._8_8_ = r2;
  auVar17._0_8_ = g2;
  auVar12 = minpd(auVar12,_DAT_005e1940);
  auVar13 = maxpd(auVar12,ZEXT816(0));
  auVar12 = minpd(auVar17,_DAT_005e1940);
  auVar12 = maxpd(auVar12,ZEXT816(0));
  if (2.0 <= b2) {
    b2 = 2.0;
  }
  if (b2 <= 0.0) {
    b2 = 0.0;
  }
  dVar16 = auVar13._0_8_;
  dVar18 = auVar13._8_8_;
  dVar15 = b2;
  iVar7 = start;
  iVar3 = end;
  if (start <= end) {
    dVar16 = auVar12._0_8_;
    dVar18 = auVar12._8_8_;
    dVar15 = b1;
    auVar12 = auVar13;
    b1 = b2;
    iVar7 = end;
    iVar3 = start;
  }
  if (iVar3 <= iVar7) {
    if (end < start) {
      start = end;
    }
    lVar4 = (long)start;
    lVar6 = 0;
    do {
      dVar9 = (double)((uint)GPalette.BaseColors[lVar4 + lVar6].field_0.field_0.b * 0x25 +
                      (uint)*(byte *)(lVar4 * 4 + 0x1bf6d91 + lVar6 * 4) * 0x8f +
                      (uint)*(byte *)(lVar4 * 4 + 0x1bf6d92 + lVar6 * 4) * 0x4d) * 0.00390625;
      uVar5 = (uint)(dVar9 * (b1 - dVar15) + dVar15 * 255.0);
      if (0xfe < (int)uVar5) {
        uVar5 = 0xff;
      }
      bVar1 = *(byte *)(lVar4 + 0x1bf7190 + lVar6);
      uVar8 = (uint)(dVar9 * (dVar16 - auVar12._0_8_) + auVar12._0_8_ * 255.0);
      uVar10 = (uint)(dVar9 * (dVar18 - auVar12._8_8_) + auVar12._8_8_ * 255.0);
      uVar11 = -(uint)((int)uVar8 < 0xff);
      uVar14 = -(uint)((int)uVar10 < 0xff);
      uVar8 = uVar8 & uVar11;
      uVar10 = uVar10 & uVar14;
      uVar11 = ~uVar11 & 0xff;
      uVar14 = ~uVar14 & 0xff;
      BVar2 = FColorMatcher::Pick(&ColorMatcher,uVar14 | uVar10 & 0xff,uVar11 | uVar8 & 0xff,
                                  uVar5 & 0xff);
      this->Remap[bVar1] = BVar2;
      *(uint *)((long)&this->Palette->field_0 + (ulong)((uint)bVar1 * 4)) =
           (uVar11 | uVar8 & 0xff) << 8 | uVar5 & 0xff | (uVar14 | uVar10 & 0xff) << 0x10;
      *(char *)((long)&this->Palette->field_0 + (ulong)((uint)bVar1 * 4) + 3) = -(bVar1 != 0);
      lVar6 = lVar6 + 1;
    } while ((iVar7 - start) + 1 != (int)lVar6);
  }
  return;
}

Assistant:

void FRemapTable::AddDesaturation(int start, int end, double r1, double g1, double b1, double r2, double g2, double b2)
{
	r1 = clamp(r1, 0.0, 2.0);
	g1 = clamp(g1, 0.0, 2.0);
	b1 = clamp(b1, 0.0, 2.0);
	r2 = clamp(r2, 0.0, 2.0);
	g2 = clamp(g2, 0.0, 2.0);
	b2 = clamp(b2, 0.0, 2.0);

	if (start > end)
	{
		swapvalues(start, end);
		swapvalues(r1, r2);
		swapvalues(g1, g2);
		swapvalues(b1, b2);
	}

	r2 -= r1;
	g2 -= g1;
	b2 -= b1;
	r1 *= 255;
	g1 *= 255;
	b1 *= 255;

	for(int c = start; c <= end; c++)
	{
		double intensity = (GPalette.BaseColors[c].r * 77 +
							GPalette.BaseColors[c].g * 143 +
							GPalette.BaseColors[c].b * 37) / 256.0;

		PalEntry pe = PalEntry(	MIN(255, int(r1 + intensity*r2)), 
								MIN(255, int(g1 + intensity*g2)), 
								MIN(255, int(b1 + intensity*b2)));

		int cc = GPalette.Remap[c];

		Remap[cc] = ColorMatcher.Pick(pe);
		Palette[cc] = pe;
		Palette[cc].a = cc == 0 ? 0:255;
	}
}